

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::spinlocking_heterogeneous_queue_basic_tests(ostream *i_ostream)

{
  concurrency_cardinality single;
  concurrency_cardinality mult;
  PrintScopeDuration dur;
  ostream *i_ostream_local;
  
  dur.m_start_time.__d.__r = (duration)(duration)i_ostream;
  PrintScopeDuration::PrintScopeDuration
            ((PrintScopeDuration *)&single,i_ostream,"spin-locking heterogeneous queue basic tests")
  ;
  SpQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1>::tests
            ((ostream *)dur.m_start_time.__d.__r);
  SpQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1>::tests
            ((ostream *)dur.m_start_time.__d.__r);
  SpQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0>::tests
            ((ostream *)dur.m_start_time.__d.__r);
  SpQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0>::tests
            ((ostream *)dur.m_start_time.__d.__r);
  PrintScopeDuration::~PrintScopeDuration((PrintScopeDuration *)&single);
  return;
}

Assistant:

void spinlocking_heterogeneous_queue_basic_tests(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "spin-locking heterogeneous queue basic tests");

        constexpr auto mult   = density::concurrency_multiple;
        constexpr auto single = density::concurrency_single;

        SpQueueBasicTests<mult, mult>::tests(i_ostream);
        SpQueueBasicTests<single, mult>::tests(i_ostream);
        SpQueueBasicTests<mult, single>::tests(i_ostream);
        SpQueueBasicTests<single, single>::tests(i_ostream);
    }